

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O2

int yang_read_bit(ly_ctx *ctx,yang_type *typ,lys_type_bit *bit,char *value)

{
  long *plVar1;
  int iVar2;
  char *id;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  
  typ->base = LY_TYPE_BITS;
  id = lydict_insert_zc(ctx,value);
  bit->name = id;
  iVar2 = lyp_check_identifier(ctx,id,LY_IDENT_SIMPLE,(lys_module *)0x0,(lys_node *)0x0);
  if (iVar2 == 0) {
    uVar3 = (typ->type->info).bits.count - 1;
    uVar4 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar4 = 0;
    }
    uVar5 = 0;
    do {
      if (uVar4 * 0x30 + 0x30 == uVar5 + 0x30) {
        return 0;
      }
      plVar1 = (long *)((long)&((typ->type->info).bits.bit)->name + uVar5);
      uVar5 = uVar5 + 0x30;
    } while ((char *)*plVar1 != bit->name);
    ly_vlog(ctx,LYE_BITS_DUPNAME,LY_VLOG_NONE,(void *)0x0);
  }
  return 1;
}

Assistant:

int
yang_read_bit(struct ly_ctx *ctx, struct yang_type *typ, struct lys_type_bit *bit, char *value)
{
    int i, j;

    typ->base = LY_TYPE_BITS;
    bit->name = lydict_insert_zc(ctx, value);
    if (lyp_check_identifier(ctx, bit->name, LY_IDENT_SIMPLE, NULL, NULL)) {
        goto error;
    }

    j = typ->type->info.bits.count - 1;
    /* check the name uniqueness */
    for (i = 0; i < j; i++) {
        if (ly_strequal(typ->type->info.bits.bit[i].name, bit->name, 1)) {
            LOGVAL(ctx, LYE_BITS_DUPNAME, LY_VLOG_NONE, NULL, bit->name);
            goto error;
        }
    }
    return EXIT_SUCCESS;

error:
    return EXIT_FAILURE;
}